

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O0

void __thiscall ExprTest_EqualPLTerm_Test::TestBody(ExprTest_EqualPLTerm_Test *this)

{
  PLTerm other;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> other_00;
  PLTerm other_01;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> other_02;
  PLTerm other_03;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> other_04;
  PLTerm other_05;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> other_06;
  PLTerm other_07;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> other_08;
  NumericConstant other_09;
  Expr e2;
  Expr e2_00;
  Expr e2_01;
  Expr e2_02;
  Expr e2_03;
  undefined1 uVar1;
  undefined1 uVar2;
  bool bVar3;
  ExprBase in_RDI;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  double breaks2 [2];
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  NumericExpr e;
  Reference y;
  Reference x;
  double slopes [3];
  double breaks [2];
  undefined7 in_stack_fffffffffffffcf8;
  undefined1 in_stack_fffffffffffffcff;
  undefined4 in_stack_fffffffffffffd00;
  type_conflict in_stack_fffffffffffffd04;
  type_conflict tVar4;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *in_stack_fffffffffffffd08;
  AssertionResult *pAVar5;
  uint in_stack_fffffffffffffd10;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffd14;
  undefined4 uVar7;
  undefined8 in_stack_fffffffffffffd18;
  int iVar8;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffffd24;
  undefined4 uVar10;
  double *in_stack_fffffffffffffd28;
  Type type;
  undefined4 in_stack_fffffffffffffd30;
  undefined4 uVar11;
  undefined4 in_stack_fffffffffffffd34;
  undefined4 uVar12;
  ExprBase in_stack_fffffffffffffd38;
  ExprBase e1;
  undefined7 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd47;
  char *expected_predicate_value;
  undefined4 in_stack_fffffffffffffd68;
  undefined4 uVar13;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffd78;
  AssertHelper *in_stack_fffffffffffffd80;
  AssertionResult local_230;
  string local_220 [48];
  Impl *local_1f0;
  BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40> local_1e8;
  undefined8 local_1d8;
  AssertionResult local_1c8;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  string local_1a8 [48];
  Impl *local_178;
  BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40> local_170;
  undefined8 local_160;
  AssertionResult local_150;
  string local_140 [48];
  Impl *local_110;
  BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40> local_108;
  undefined8 local_f8;
  AssertionResult local_e8;
  string local_d8 [64];
  Impl *local_98;
  BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40> local_90;
  undefined8 local_80;
  AssertionResult local_70;
  ExprBase local_60;
  BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40> local_58;
  undefined8 local_50;
  BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3> local_48;
  BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3> local_40;
  char local_38 [32];
  undefined8 local_18;
  undefined8 uStack_10;
  
  iVar8 = (int)((ulong)in_stack_fffffffffffffd18 >> 0x20);
  local_18 = 0x4014000000000000;
  uStack_10 = 0x4024000000000000;
  local_38[0x10] = '\0';
  local_38[0x11] = '\0';
  local_38[0x12] = '\0';
  local_38[0x13] = '\0';
  local_38[0x14] = '\0';
  local_38[0x15] = '\0';
  local_38[0x16] = -0x10;
  local_38[0x17] = '?';
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = -0x10;
  local_38[7] = -0x41;
  local_38[8] = '\0';
  local_38[9] = '\0';
  local_38[10] = '\0';
  local_38[0xb] = '\0';
  local_38[0xc] = '\0';
  local_38[0xd] = '\0';
  local_38[0xe] = '\0';
  local_38[0xf] = '\0';
  uVar13 = 0;
  local_40.super_ExprBase.impl_ =
       (ExprBase)
       ExprTest::MakeVariable
                 ((ExprTest *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8),0);
  local_48.super_ExprBase.impl_ =
       (ExprBase)
       ExprTest::MakeVariable
                 ((ExprTest *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8),0);
  local_60.impl_ = (Impl *)local_40.super_ExprBase.impl_;
  expected_predicate_value = local_38;
  local_58.super_ExprBase.impl_ =
       (ExprBase)
       ExprTest::MakePLTerm
                 ((ExprTest *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                  (int)((ulong)in_stack_fffffffffffffd38.impl_ >> 0x20),
                  (double *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                  in_stack_fffffffffffffd28,(Reference)in_RDI.impl_);
  other.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffffd14;
  other.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffffd10;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::PLTerm>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffd08,other,
             in_stack_fffffffffffffd04);
  local_80 = local_50;
  other_00.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffd14;
  other_00.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffd10;
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (in_stack_fffffffffffffd08,other_00,in_stack_fffffffffffffd04);
  local_98 = (Impl *)local_40.super_ExprBase.impl_;
  local_90.super_ExprBase.impl_ =
       (ExprBase)
       ExprTest::MakePLTerm
                 ((ExprTest *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                  (int)((ulong)in_stack_fffffffffffffd38.impl_ >> 0x20),
                  (double *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                  in_stack_fffffffffffffd28,(Reference)in_RDI.impl_);
  other_01.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffffd14;
  other_01.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffffd10;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr<mp::PLTerm>
            (in_stack_fffffffffffffd08,other_01,in_stack_fffffffffffffd04);
  e2.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffd34;
  e2.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffd30;
  mp::Equal((Expr)in_stack_fffffffffffffd38.impl_,e2);
  this_00 = &local_70;
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
             (bool)in_stack_fffffffffffffcff);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!(bool)uVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(uVar1,in_stack_fffffffffffffd78),&this_00->success_,
               (char *)CONCAT44(uVar13,in_stack_fffffffffffffd68),expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
               (Type)((ulong)in_stack_fffffffffffffd28 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),iVar8,
               (char *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffd80,(Message *)CONCAT17(uVar1,in_stack_fffffffffffffd78));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
    std::__cxx11::string::~string(local_d8);
    testing::Message::~Message((Message *)0x135817);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x135892);
  local_f8 = local_50;
  uVar12 = 0;
  other_02.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffd14;
  other_02.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffd10;
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (in_stack_fffffffffffffd08,other_02,in_stack_fffffffffffffd04);
  local_110 = (Impl *)local_40.super_ExprBase.impl_;
  local_108.super_ExprBase.impl_ =
       (ExprBase)
       ExprTest::MakePLTerm
                 ((ExprTest *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                  (int)((ulong)in_stack_fffffffffffffd38.impl_ >> 0x20),
                  (double *)CONCAT44(uVar12,in_stack_fffffffffffffd30),in_stack_fffffffffffffd28,
                  (Reference)in_RDI.impl_);
  other_03.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffffd14;
  other_03.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffffd10;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr<mp::PLTerm>
            (in_stack_fffffffffffffd08,other_03,in_stack_fffffffffffffd04);
  e2_00.super_ExprBase.impl_._4_4_ = uVar12;
  e2_00.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffd30;
  mp::Equal((Expr)in_stack_fffffffffffffd38.impl_,e2_00);
  e1.impl_ = (Impl *)&local_e8;
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
             (bool)in_stack_fffffffffffffcff);
  uVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)e1.impl_);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)CONCAT44(uVar12,in_stack_fffffffffffffd30));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(uVar1,in_stack_fffffffffffffd78),&this_00->success_,
               (char *)CONCAT44(uVar13,in_stack_fffffffffffffd68),expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(uVar12,in_stack_fffffffffffffd30),
               (Type)((ulong)in_stack_fffffffffffffd28 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),iVar8,
               (char *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffd80,(Message *)CONCAT17(uVar1,in_stack_fffffffffffffd78));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
    std::__cxx11::string::~string(local_140);
    testing::Message::~Message((Message *)0x135a34);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x135aaf);
  local_160 = local_50;
  uVar10 = 0;
  other_04.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffd14;
  other_04.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffd10;
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (in_stack_fffffffffffffd08,other_04,in_stack_fffffffffffffd04);
  local_178 = (Impl *)local_48.super_ExprBase.impl_;
  local_170.super_ExprBase.impl_ =
       (ExprBase)
       ExprTest::MakePLTerm
                 ((ExprTest *)CONCAT17(uVar2,in_stack_fffffffffffffd40),
                  (int)((ulong)e1.impl_ >> 0x20),
                  (double *)CONCAT44(uVar12,in_stack_fffffffffffffd30),in_stack_fffffffffffffd28,
                  (Reference)in_RDI.impl_);
  other_05.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffffd14;
  other_05.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffffd10;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr<mp::PLTerm>
            (in_stack_fffffffffffffd08,other_05,in_stack_fffffffffffffd04);
  e2_01.super_ExprBase.impl_._4_4_ = uVar12;
  e2_01.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffd30;
  mp::Equal((Expr)e1.impl_,e2_01);
  pAVar5 = &local_150;
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
             (bool)in_stack_fffffffffffffcff);
  bVar3 = testing::AssertionResult::operator_cast_to_bool(pAVar5);
  uVar11 = CONCAT13(bVar3,(int3)in_stack_fffffffffffffd30);
  if (!bVar3) {
    testing::Message::Message((Message *)CONCAT44(uVar12,uVar11));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(uVar1,in_stack_fffffffffffffd78),&this_00->success_,
               (char *)CONCAT44(uVar13,in_stack_fffffffffffffd68),expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(uVar12,uVar11),(Type)((ulong)pAVar5 >> 0x20),
               (char *)CONCAT44(uVar10,in_stack_fffffffffffffd20),iVar8,
               (char *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffd80,(Message *)CONCAT17(uVar1,in_stack_fffffffffffffd78));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
    std::__cxx11::string::~string(local_1a8);
    testing::Message::~Message((Message *)0x135c51);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x135ccc);
  local_1b8 = 0x4014000000000000;
  uStack_1b0 = 0x4026000000000000;
  local_1d8 = local_50;
  uVar7 = 0;
  other_06.super_ExprBase.impl_._4_4_ = 0;
  other_06.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffd10;
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (in_stack_fffffffffffffd08,other_06,in_stack_fffffffffffffd04);
  local_1f0 = (Impl *)local_40.super_ExprBase.impl_;
  local_1e8.super_ExprBase.impl_ =
       (ExprBase)
       ExprTest::MakePLTerm
                 ((ExprTest *)CONCAT17(uVar2,in_stack_fffffffffffffd40),
                  (int)((ulong)e1.impl_ >> 0x20),(double *)CONCAT44(uVar12,uVar11),(double *)pAVar5,
                  (Reference)in_RDI.impl_);
  type = (Type)((ulong)pAVar5 >> 0x20);
  other_07.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.impl_._4_4_ =
       uVar7;
  other_07.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffffd10;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr<mp::PLTerm>
            (in_stack_fffffffffffffd08,other_07,in_stack_fffffffffffffd04);
  e2_02.super_ExprBase.impl_._4_4_ = uVar12;
  e2_02.super_ExprBase.impl_._0_4_ = uVar11;
  mp::Equal((Expr)e1.impl_,e2_02);
  pAVar5 = &local_1c8;
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
             (bool)in_stack_fffffffffffffcff);
  bVar3 = testing::AssertionResult::operator_cast_to_bool(pAVar5);
  iVar8 = (int)((ulong)pAVar5 >> 0x20);
  uVar9 = CONCAT13(bVar3,(int3)in_stack_fffffffffffffd20);
  if (!bVar3) {
    testing::Message::Message((Message *)CONCAT44(uVar12,uVar11));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(uVar1,in_stack_fffffffffffffd78),&this_00->success_,
               (char *)CONCAT44(uVar13,in_stack_fffffffffffffd68),expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(uVar12,uVar11),type,(char *)CONCAT44(uVar10,uVar9),iVar8,
               (char *)CONCAT44(uVar7,in_stack_fffffffffffffd10));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffd80,(Message *)CONCAT17(uVar1,in_stack_fffffffffffffd78));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
    std::__cxx11::string::~string(local_220);
    testing::Message::~Message((Message *)0x135e7d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x135ef8);
  tVar4 = 0;
  other_08.super_ExprBase.impl_._4_4_ = uVar7;
  other_08.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffd10;
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (in_stack_fffffffffffffd08,other_08,0);
  ExprTest::MakeConst((ExprTest *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8),
                      6.27244499137275e-318);
  other_09.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_._4_4_ = uVar7;
  other_09.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffffd10;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr<mp::NumericConstant>
            (in_stack_fffffffffffffd08,other_09,tVar4);
  e2_03.super_ExprBase.impl_._4_4_ = uVar12;
  e2_03.super_ExprBase.impl_._0_4_ = uVar11;
  mp::Equal((Expr)e1.impl_,e2_03);
  pAVar5 = &local_230;
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT44(tVar4,in_stack_fffffffffffffd00),
             (bool)in_stack_fffffffffffffcff);
  bVar3 = testing::AssertionResult::operator_cast_to_bool(pAVar5);
  uVar6 = CONCAT13(bVar3,(int3)in_stack_fffffffffffffd10);
  if (!bVar3) {
    testing::Message::Message((Message *)CONCAT44(uVar12,uVar11));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(uVar1,in_stack_fffffffffffffd78),&this_00->success_,
               (char *)CONCAT44(uVar13,in_stack_fffffffffffffd68),expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(uVar12,uVar11),type,(char *)CONCAT44(uVar10,uVar9),iVar8,
               (char *)CONCAT44(uVar7,uVar6));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffd80,(Message *)CONCAT17(uVar1,in_stack_fffffffffffffd78));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(tVar4,in_stack_fffffffffffffd00));
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffd80);
    testing::Message::~Message((Message *)0x136075);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1360ed);
  return;
}

Assistant:

TEST_F(ExprTest, EqualPLTerm) {
  double breaks[] = {5, 10};
  double slopes[] = {-1, 0, 1};
  mp::Reference x = MakeVariable(0), y = MakeVariable(1);
  NumericExpr e = MakePLTerm(2, breaks, slopes, x);
  EXPECT_TRUE(Equal(e, MakePLTerm(2, breaks, slopes, x)));
  EXPECT_FALSE(Equal(e, MakePLTerm(1, breaks, slopes, x)));
  EXPECT_FALSE(Equal(e, MakePLTerm(2, breaks, slopes, y)));
  double breaks2[] = {5, 11};
  EXPECT_FALSE(Equal(e, MakePLTerm(2, breaks2, slopes, x)));
  EXPECT_FALSE(Equal(e, MakeConst(42)));
}